

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.h
# Opt level: O3

int64_t __thiscall icu_63::CEFinalizer::modifyCE(CEFinalizer *this,int64_t ce)

{
  uint uVar1;
  
  if ((uint)ce + 0xba000000 < 0xc0000000) {
    return 0x101000100;
  }
  uVar1 = (uint)((ulong)(ce + -0x4040000006002000) >> 0x20);
  return (ulong)((uint)ce & 0xc000) |
         this->finalCEs
         [(uint)((ulong)(ce + -0x4040000006002000) >> 0x18) & 0x3f |
          uVar1 >> 10 & 0x1fc0 | uVar1 >> 0xb & 0xfe000];
}

Assistant:

static inline UBool isTempCE(int64_t ce) {
        uint32_t sec = (uint32_t)ce >> 24;
        return 6 <= sec && sec <= 0x45;
    }